

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Stress::(anonymous_namespace)::TextureSamplerCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  undefined1 local_1a8 [8];
  ostringstream buf;
  allocator<char> local_19;
  void *local_18;
  TextureSamplerCase *this_local;
  
  local_18 = this;
  this_local = (TextureSamplerCase *)__return_storage_ptr__;
  if (*(int *)((long)this + 0x84) == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               "attribute highp vec4 a_pos;\nattribute highp vec4 a_attr;\nvarying mediump vec4 v_attr;\nvoid main ()\n{\n\tv_attr = a_attr;\n\tgl_Position = a_pos;\n}\n"
               ,&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::operator<<((ostream *)local_1a8,
                    "attribute highp vec4 a_pos;\nattribute highp vec2 a_attr;\n");
    if (*(int *)((long)this + 0x88) == 2) {
      std::operator<<((ostream *)local_1a8,"uniform highp samplerCube u_sampler;\n");
    }
    else {
      std::operator<<((ostream *)local_1a8,"uniform highp sampler2D u_sampler;\n");
    }
    std::operator<<((ostream *)local_1a8,"varying mediump vec4 v_out;\nvoid main ()\n{\n");
    if (*(int *)((long)this + 0x88) == 0) {
      std::operator<<((ostream *)local_1a8,"\tv_out = texture2DLod(u_sampler, a_attr, 0.0);\n");
    }
    else if (*(int *)((long)this + 0x88) == 1) {
      std::operator<<((ostream *)local_1a8,"\tv_out = texture2DLod(u_sampler, a_attr, a_attr.x);\n")
      ;
    }
    else if (*(int *)((long)this + 0x88) == 2) {
      std::operator<<((ostream *)local_1a8,
                      "\tv_out = textureCubeLod(u_sampler, vec3(a_attr, a_attr.x+a_attr.y), 0.0);\n"
                     );
    }
    std::operator<<((ostream *)local_1a8,"\n\tgl_Position = a_pos;\n}\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSamplerCase::genVertexSource (void) const
{
	// vertex shader is passthrough, fragment does the calculations
	if (m_type == TYPE_FRAGMENT)
		return s_attrPassthroughVertexShaderSource;

	// vertex shader does the calculations
	std::ostringstream buf;
	buf <<	"attribute highp vec4 a_pos;\n"
			"attribute highp vec2 a_attr;\n";

	if (m_testType != TEST_TEX_COORD_CUBE)
		buf <<	"uniform highp sampler2D u_sampler;\n";
	else
		buf <<	"uniform highp samplerCube u_sampler;\n";

	buf <<	"varying mediump vec4 v_out;\n"
			"void main ()\n"
			"{\n";

	if (m_testType == TEST_TEX_COORD)
		buf <<	"	v_out = texture2DLod(u_sampler, a_attr, 0.0);\n";
	else if (m_testType == TEST_LOD)
		buf <<	"	v_out = texture2DLod(u_sampler, a_attr, a_attr.x);\n";
	else if (m_testType == TEST_TEX_COORD_CUBE)
		buf <<	"	v_out = textureCubeLod(u_sampler, vec3(a_attr, a_attr.x+a_attr.y), 0.0);\n";
	else
		DE_ASSERT(DE_FALSE);

	buf <<	"\n"
			"	gl_Position = a_pos;\n"
			"}\n";

	return buf.str();
}